

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

Rect __thiscall nite::Rect::operator-(Rect *this,Rect *r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *in_RDI;
  Rect RVar4;
  
  fVar1 = this->y;
  fVar2 = this->w;
  RVar4.x = this->x - r->x;
  RVar4.y = 0.0;
  fVar3 = this->h;
  *in_RDI = RVar4.x;
  RVar4.w = fVar1 - r->y;
  in_RDI[1] = RVar4.w;
  in_RDI[2] = fVar2 - r->w;
  in_RDI[3] = fVar3 - r->h;
  RVar4.h = 0.0;
  return RVar4;
}

Assistant:

nite::Rect nite::Rect::operator-(const nite::Rect &r){
	Rect R = *this;
	R.x -= r.x;
	R.y -= r.y;
	R.w -= r.w;
	R.h -= r.h;
	return R;
}